

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void __thiscall
TimerTest_detachedWithIterationsCancel_Test::TimerTest_detachedWithIterationsCancel_Test
          (TimerTest_detachedWithIterationsCancel_Test *this)

{
  TimerTest_detachedWithIterationsCancel_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__TimerTest_detachedWithIterationsCancel_Test_0080e7a0;
  return;
}

Assistant:

TEST(TimerTest, detachedWithIterationsCancel) {
	size_t iterations{ 0 };
	std::promise<void> promise;

	{
		timer{period, total_iterations, [&iterations, &promise](timer& in_timer) {
			if (++iterations == total_iterations) {
				promise.set_value();
				in_timer.cancel();
			}
		}}.detach();
	}

	EXPECT_EQ(promise.get_future().wait_for(timeout), std::future_status::ready);
}